

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

void Abc_AigSetNodePhases(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 != 0) {
    pAVar6 = Abc_AigConst1(pNtk);
    *(uint *)&pAVar6->field_0x14 = *(uint *)&pAVar6->field_0x14 & 0xffffff7f | 0x80;
    for (local_1c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
      pAVar6 = Abc_NtkPi(pNtk,local_1c);
      *(uint *)&pAVar6->field_0x14 = *(uint *)&pAVar6->field_0x14 & 0xffffff7f;
    }
    for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_1c < iVar1; local_1c = local_1c + 1)
    {
      pAVar6 = Abc_NtkBox(pNtk,local_1c);
      iVar1 = Abc_ObjIsLatch(pAVar6);
      if (iVar1 != 0) {
        pAVar6 = Abc_NtkBox(pNtk,local_1c);
        pAVar6 = Abc_ObjFanout0(pAVar6);
        uVar2 = Abc_LatchIsInit1(pAVar6);
        *(uint *)&pAVar6->field_0x14 = *(uint *)&pAVar6->field_0x14 & 0xffffff7f | (uVar2 & 1) << 7;
      }
    }
    for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1)
    {
      pAVar6 = Abc_NtkObj(pNtk,local_1c);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar6), iVar1 != 0)) {
        pAVar7 = Abc_ObjFanin0(pAVar6);
        uVar2 = *(uint *)&pAVar7->field_0x14;
        uVar3 = Abc_ObjFaninC0(pAVar6);
        pAVar7 = Abc_ObjFanin1(pAVar6);
        uVar5 = *(uint *)&pAVar7->field_0x14;
        uVar4 = Abc_ObjFaninC1(pAVar6);
        *(uint *)&pAVar6->field_0x14 =
             *(uint *)&pAVar6->field_0x14 & 0xffffff7f |
             ((uVar2 >> 7 & 1 ^ uVar3) & (uVar5 >> 7 & 1 ^ uVar4) & 1) << 7;
      }
    }
    for (local_1c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
      pAVar6 = Abc_NtkPo(pNtk,local_1c);
      pAVar7 = Abc_ObjFanin0(pAVar6);
      uVar2 = *(uint *)&pAVar7->field_0x14;
      uVar5 = Abc_ObjFaninC0(pAVar6);
      *(uint *)&pAVar6->field_0x14 =
           *(uint *)&pAVar6->field_0x14 & 0xffffff7f | ((uVar2 >> 7 & 1 ^ uVar5) & 1) << 7;
    }
    for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_1c < iVar1; local_1c = local_1c + 1)
    {
      pAVar6 = Abc_NtkBox(pNtk,local_1c);
      iVar1 = Abc_ObjIsLatch(pAVar6);
      if (iVar1 != 0) {
        pAVar6 = Abc_NtkBox(pNtk,local_1c);
        pAVar6 = Abc_ObjFanin0(pAVar6);
        pAVar7 = Abc_ObjFanin0(pAVar6);
        uVar2 = *(uint *)&pAVar7->field_0x14;
        uVar5 = Abc_ObjFaninC0(pAVar6);
        *(uint *)&pAVar6->field_0x14 =
             *(uint *)&pAVar6->field_0x14 & 0xffffff7f | ((uVar2 >> 7 & 1 ^ uVar5) & 1) << 7;
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                ,0x571,"void Abc_AigSetNodePhases(Abc_Ntk_t *)");
}

Assistant:

void Abc_AigSetNodePhases( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    Abc_AigConst1(pNtk)->fPhase = 1;
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->fPhase = 0;
    Abc_NtkForEachLatchOutput( pNtk, pObj, i )
        pObj->fPhase = Abc_LatchIsInit1(pObj);
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj)) & (Abc_ObjFanin1(pObj)->fPhase ^ Abc_ObjFaninC1(pObj));
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj));
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj));
}